

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# import_source.cpp
# Opt level: O0

void __thiscall ImportSource_hasImportSource_Test::TestBody(ImportSource_hasImportSource_Test *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this_00;
  byte bVar1;
  bool bVar2;
  element_type *peVar3;
  char *pcVar4;
  AssertionResult local_d0 [2];
  AssertHelper local_b0 [8];
  Message local_a8 [15];
  bool local_99;
  undefined1 local_98 [8];
  AssertionResult gtest_ar__1;
  AssertHelper local_68 [8];
  Message local_60 [31];
  bool local_41;
  undefined1 local_40 [8];
  AssertionResult gtest_ar_;
  ImportSourcePtr importSource;
  ImporterPtr importer;
  ImportSource_hasImportSource_Test *this_local;
  
  this_00 = &importSource.super___shared_ptr<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount;
  libcellml::Importer::create(SUB81(this_00,0));
  libcellml::ImportSource::create();
  peVar3 = std::__shared_ptr_access<libcellml::Importer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Importer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this_00);
  bVar1 = libcellml::Importer::hasImportSource((shared_ptr *)peVar3);
  local_41 = (bool)(~bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_40,&local_41,(type *)0x0)
  ;
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_40);
  if (!bVar2) {
    testing::Message::Message(local_60);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&gtest_ar__1.message_,local_40,
               "importer->hasImportSource(importSource)","true");
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (local_68,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/import_source/import_source.cpp"
               ,0x4e,pcVar4);
    testing::internal::AssertHelper::operator=(local_68,local_60);
    testing::internal::AssertHelper::~AssertHelper(local_68);
    std::__cxx11::string::~string((string *)&gtest_ar__1.message_);
    testing::Message::~Message(local_60);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_40);
  peVar3 = std::__shared_ptr_access<libcellml::Importer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Importer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&importSource.
                          super___shared_ptr<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount);
  libcellml::Importer::addImportSource((shared_ptr *)peVar3);
  peVar3 = std::__shared_ptr_access<libcellml::Importer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Importer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&importSource.
                          super___shared_ptr<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount);
  bVar1 = libcellml::Importer::hasImportSource((shared_ptr *)peVar3);
  local_99 = (bool)(bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_98,&local_99,(type *)0x0)
  ;
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_98);
  if (!bVar2) {
    testing::Message::Message(local_a8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (local_d0,local_98,"importer->hasImportSource(importSource)","false");
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (local_b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/import_source/import_source.cpp"
               ,0x52,pcVar4);
    testing::internal::AssertHelper::operator=(local_b0,local_a8);
    testing::internal::AssertHelper::~AssertHelper(local_b0);
    std::__cxx11::string::~string((string *)local_d0);
    testing::Message::~Message(local_a8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_98);
  std::shared_ptr<libcellml::ImportSource>::~shared_ptr
            ((shared_ptr<libcellml::ImportSource> *)&gtest_ar_.message_);
  std::shared_ptr<libcellml::Importer>::~shared_ptr
            ((shared_ptr<libcellml::Importer> *)
             &importSource.super___shared_ptr<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return;
}

Assistant:

TEST(ImportSource, hasImportSource)
{
    auto importer = libcellml::Importer::create();

    auto importSource = libcellml::ImportSource::create();

    EXPECT_FALSE(importer->hasImportSource(importSource));

    importer->addImportSource(importSource);

    EXPECT_TRUE(importer->hasImportSource(importSource));
}